

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

void extraDecomposeCover(DdManager *dd,DdNode *zC,DdNode **zC0,DdNode **zC1,DdNode **zC2)

{
  uint uVar1;
  int iVar2;
  anon_union_16_2_50f58667_for_type *paVar3;
  int iVar4;
  
  uVar1 = zC->index;
  if ((uVar1 & 1) == 0) {
    paVar3 = &zC->type;
    zC = (zC->type).kids.E;
    *zC1 = (DdNode *)paVar3->value;
    iVar2 = 0x7fffffff;
    if ((ulong)zC->index != 0x7fffffff) {
      iVar2 = dd->permZ[zC->index];
    }
    iVar4 = -0x80000000;
    if (uVar1 != 0x7fffffff) {
      iVar4 = dd->permZ[uVar1] + 1;
    }
    if (iVar2 != iVar4) {
      *zC2 = zC;
      paVar3 = (anon_union_16_2_50f58667_for_type *)&dd->zero;
      goto LAB_008211c2;
    }
  }
  else {
    *zC1 = dd->zero;
  }
  paVar3 = &zC->type;
  *zC2 = (zC->type).kids.E;
LAB_008211c2:
  *zC0 = (DdNode *)paVar3->value;
  return;
}

Assistant:

void 
extraDecomposeCover( 
  DdManager* dd,    /* the manager */
  DdNode*  zC,      /* the cover */
  DdNode** zC0,     /* the pointer to the negative var cofactor */ 
  DdNode** zC1,     /* the pointer to the positive var cofactor */ 
  DdNode** zC2 )    /* the pointer to the cofactor without var */ 
{
    if ( (zC->index & 1) == 0 ) 
    { /* the top variable is present in positive polarity and maybe in negative */

        DdNode *Temp = cuddE( zC );
        *zC1  = cuddT( zC );
        if ( cuddIZ(dd,Temp->index) == cuddIZ(dd,zC->index) + 1 )
        {   /* Temp is not a terminal node 
             * top var is present in negative polarity */
            *zC2 = cuddE( Temp );
            *zC0 = cuddT( Temp );
        }
        else
        {   /* top var is not present in negative polarity */
            *zC2 = Temp;
            *zC0 = dd->zero;
        }
    }
    else 
    { /* the top variable is present only in negative */
        *zC1 = dd->zero;
        *zC2 = cuddE( zC );
        *zC0 = cuddT( zC );
    }
}